

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::GeometryShaderTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,GeometryShaderTestInstance *this,VkQueryPool queryPool
          )

{
  ParametersGraphic *pPVar1;
  bool bVar2;
  VkResult result_00;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkPrimitiveTopology VVar5;
  ulong uVar6;
  undefined *puVar7;
  deUint64 dStackY_80;
  allocator<char> local_59;
  string local_58;
  deUint64 result;
  
  pDVar3 = Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  pVVar4 = Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  result = 0;
  pPVar1 = (this->super_GraphicBasicTestInstance).m_parametersGraphic;
  dStackY_80 = 0;
  switch(pPVar1->queryStatisticFlags << 0x1d | pPVar1->queryStatisticFlags - 8 >> 3) {
  case 0:
    VVar5 = pPVar1->primitiveTopology;
    uVar6 = (ulong)VVar5;
    if (8 < uVar6) {
      dStackY_80 = 6;
LAB_0067de45:
      if (VVar5 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY) {
        dStackY_80 = 0;
      }
      goto switchD_0067de0b_caseD_2;
    }
    puVar7 = &DAT_009a8490;
    break;
  case 1:
  case 3:
  case 7:
    VVar5 = pPVar1->primitiveTopology;
    uVar6 = (ulong)VVar5;
    if (8 < uVar6) {
      dStackY_80 = 0xc;
      goto LAB_0067de45;
    }
    puVar7 = &DAT_009a84d8;
    break;
  default:
    goto switchD_0067de0b_caseD_2;
  }
  dStackY_80 = *(deUint64 *)(puVar7 + uVar6 * 8);
switchD_0067de0b_caseD_2:
  result_00 = (*pDVar3->_vptr_DeviceInterface[0x20])
                        (pDVar3,pVVar4,queryPool.m_internal,0,1,8,&result,0,1);
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x5ca);
  if (dStackY_80 == result) {
    if ((1 < ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology -
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) ||
       (bVar2 = GraphicBasicTestInstance::checkImage(&this->super_GraphicBasicTestInstance), bVar2))
    {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Pass",&local_59);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_58);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Result image doesn\'t match expected image.",&local_59);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_58);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"QueryPoolResults incorrect",&local_59);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GeometryShaderTestInstance::checkResult (VkQueryPool queryPool)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	deUint64				result		= 0u;
	deUint64				expected	= 0u;

	switch(m_parametersGraphic.queryStatisticFlags)
	{
		case VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_INVOCATIONS_BIT:
			expected =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST						? 16u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST						? 8u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP						? 15u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					? 4u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP					? 4u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN						? 14u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			? 4u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		? 13u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		? 2u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	? 6u :
						0u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_GEOMETRY_SHADER_PRIMITIVES_BIT:
		case VK_QUERY_PIPELINE_STATISTIC_CLIPPING_INVOCATIONS_BIT:
		case VK_QUERY_PIPELINE_STATISTIC_CLIPPING_PRIMITIVES_BIT:
			expected =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST						? 112u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST						? 32u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP						? 60u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					? 8u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP					? 8u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN						? 28u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			? 16u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		? 52u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		? 4u :
						m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	? 12u :
						0u;
			break;
		default:
			DE_ASSERT(0);
		break;
	}
	VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
	if (expected != result)
		return tcu::TestStatus::fail("QueryPoolResults incorrect");

	if ( (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST || m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP ) && !checkImage())
		return tcu::TestStatus::fail("Result image doesn't match expected image.");

	return tcu::TestStatus::pass("Pass");
}